

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::dashtrailing(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Char CVar1;
  uint uVar2;
  uint uVar3;
  uint Value;
  
  requireDStackDepth(this,2,"COUNT");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,0);
  do {
    Value = uVar3;
    if ((int)Value < 1) break;
    CVar1 = dataSpaceAt(this,(uVar2 - 1) + Value);
    uVar3 = Value - 1;
  } while (CVar1 == ' ');
  ForthStack<unsigned_int>::setTop(this_00,Value);
  return;
}

Assistant:

void dashtrailing() {
			REQUIRE_DSTACK_DEPTH(2, "COUNT");
			auto caddr = CADDR(dStack.getTop(1));
			SCell count = dStack.getTop(0);
			while(count>0){
			auto trailingChar = (getDataChar(caddr+count-1));
			if(trailingChar==' '){
				count--;
			} else {
				break;
			}
			}
			//Nothing done
			dStack.setTop(static_cast<Cell>(count));
		}